

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

void __thiscall
TasGrid::GridLocalPolynomial::applyTransformationTransposed<1,(TasGrid::RuleLocal::erule)3>
          (GridLocalPolynomial *this,double *weights,MultiIndexSet *work,
          vector<int,_std::allocator<int>_> *active_points)

{
  int iVar1;
  size_t sVar2;
  pointer piVar3;
  double dVar4;
  GridLocalPolynomial *pGVar5;
  GridLocalPolynomial *pGVar6;
  void *pvVar7;
  _Bit_type *p_Var8;
  pointer piVar9;
  int *piVar10;
  int iVar11;
  long lVar12;
  pointer piVar13;
  pointer pdVar14;
  long lVar15;
  _Bit_type *p_Var16;
  int iVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  GridLocalPolynomial *pGVar24;
  long lVar25;
  ulong uVar26;
  int iVar27;
  int iVar28;
  pointer piVar29;
  pointer piVar30;
  vector<double,_std::allocator<double>_> node;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> level;
  Data2D<int> lparents;
  undefined1 auStack_138 [4];
  int local_134;
  AccelerationContext *local_130;
  GridLocalPolynomial *local_128;
  int local_120;
  int local_11c;
  MultiIndexSet *local_118;
  vector<int,_std::allocator<int>_> *local_110;
  pointer local_108;
  vector<double,_std::allocator<double>_> local_100;
  vector<bool,_std::allocator<bool>_> local_e8;
  vector<int,_std::allocator<int>_> local_c0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_90;
  Data2D<int> local_78;
  double *local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  iVar17 = (int)(this->parents).num_strips;
  local_128 = this;
  local_118 = work;
  local_50 = weights;
  if (work->cache_num_indexes == iVar17) {
    local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_78.stride = 0;
    local_78.num_strips = 0;
    local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_134 = iVar17;
  }
  else {
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)3>(&local_78,work);
    iVar17 = (int)(this->parents).num_strips;
    local_134 = work->cache_num_indexes;
  }
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_90,
             (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_e8);
  pGVar24 = local_128;
  piVar30 = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar12 = (long)(active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar30;
  if (lVar12 == 0) {
    local_130 = (AccelerationContext *)0x0;
  }
  else {
    lVar12 = lVar12 >> 2;
    sVar2 = local_118->num_dimensions;
    piVar29 = (local_118->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_130 = (AccelerationContext *)0x0;
    lVar19 = 0;
    do {
      lVar25 = (long)piVar30[lVar19] * sVar2;
      uVar22 = piVar29[lVar25] + 1;
      uVar20 = 0;
      if (1 < uVar22) {
        uVar20 = 0;
        do {
          uVar22 = (int)uVar22 >> 1;
          uVar20 = uVar20 + 1;
        } while (1 < uVar22);
      }
      lVar23 = (long)(local_128->super_BaseCanonicalGrid).num_dimensions;
      if (1 < lVar23) {
        lVar15 = 1;
        do {
          uVar22 = piVar29[lVar25 + lVar15] + 1;
          iVar27 = 0;
          if (1 < uVar22) {
            iVar27 = 0;
            do {
              uVar22 = (int)uVar22 >> 1;
              iVar27 = iVar27 + 1;
            } while (1 < uVar22);
          }
          uVar20 = uVar20 + iVar27;
          lVar15 = lVar15 + 1;
        } while (lVar15 != lVar23);
      }
      if ((int)local_130 <= (int)uVar20) {
        local_130 = (AccelerationContext *)(ulong)uVar20;
      }
      *(uint *)((long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar19 * 4) = uVar20;
      lVar19 = lVar19 + 1;
    } while (lVar19 != lVar12 + (ulong)(lVar12 == 0));
  }
  local_120 = iVar17;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_a8,(long)local_128->top_level + 1,(allocator_type *)&local_e8);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_c0,(long)pGVar24->top_level + 1,(allocator_type *)&local_e8);
  local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            (&local_e8,(long)local_118->cache_num_indexes,(bool *)&local_100,
             (allocator_type *)(auStack_138 + 3));
  iVar27 = (local_128->super_BaseCanonicalGrid).num_dimensions;
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_100,(long)iVar27,(allocator_type *)(auStack_138 + 3));
  if (0 < (int)local_130) {
    piVar9 = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    piVar30 = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pGVar24 = local_128;
    iVar28 = local_134;
    local_11c = iVar27;
    local_110 = active_points;
    do {
      piVar13 = piVar30;
      if (piVar9 != piVar30) {
        piVar29 = (pointer)0x0;
        do {
          uVar20 = local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
          p_Var8 = local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
          if (*(int *)((long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + (long)piVar29 * 4) == (int)local_130
             ) {
            lVar12 = (long)(pGVar24->super_BaseCanonicalGrid).num_dimensions;
            if (0 < lVar12) {
              iVar27 = piVar13[(long)piVar29];
              sVar2 = local_118->num_dimensions;
              piVar3 = (local_118->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar19 = 0;
              do {
                iVar18 = piVar3[(long)iVar27 * sVar2 + lVar19];
                uVar22 = iVar18 + 1;
                dVar4 = 1.0;
                if (1 < uVar22) {
                  iVar21 = 1;
                  do {
                    uVar22 = (int)uVar22 >> 1;
                    iVar21 = iVar21 * 2;
                  } while (1 < uVar22);
                  dVar4 = (double)iVar21;
                }
                *(double *)
                 (CONCAT71(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,
                           local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start._0_1_) + lVar19 * 8) =
                     (double)(iVar18 * 2 + 3) / dVar4 + -3.0;
                lVar19 = lVar19 + 1;
              } while (lVar19 != lVar12);
            }
            p_Var16 = local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            local_108 = piVar29;
            if (local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p !=
                local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._M_p) {
              memset(local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                     (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              p_Var16 = p_Var8;
              pGVar24 = local_128;
              iVar28 = local_134;
            }
            if (uVar20 != 0) {
              *p_Var16 = *p_Var16 & ~(0xffffffffffffffffU >> (-(char)uVar20 & 0x3fU));
            }
            *local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = 0;
            piVar13 = (local_110->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            *local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = piVar13[(long)local_108];
            active_points = local_110;
            piVar29 = local_108;
            if (*local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start < local_11c) {
              iVar18 = 0;
              piVar10 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar14 = (pointer)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
              iVar27 = local_11c;
              do {
                lVar12 = (long)iVar18;
                iVar21 = piVar10[lVar12];
                if (iVar21 < iVar27) {
                  pGVar5 = pGVar24;
                  if (iVar28 != iVar17) {
                    pGVar5 = (GridLocalPolynomial *)auStack_138;
                  }
                  pGVar6 = pGVar24;
                  if (iVar28 != iVar17) {
                    pGVar6 = (GridLocalPolynomial *)auStack_138;
                  }
                  iVar1 = (pGVar6->parents).vec.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start
                          [(long)*(int *)((long)pdVar14 + lVar12 * 4) * (pGVar5->parents).stride +
                           (long)iVar21];
                  uVar26 = (ulong)iVar1;
                  if (uVar26 != 0xffffffffffffffff) {
                    iVar11 = iVar1 + 0x3f;
                    if (-1 < iVar1) {
                      iVar11 = iVar1;
                    }
                    piVar30 = (pointer)(ulong)((uVar26 & 0x800000000000003f) < 0x8000000000000001);
                    if ((local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [(long)piVar30 + (long)(iVar11 >> 6) + -1] >> (uVar26 & 0x3f) & 1) == 0) {
                      lVar19 = uVar26 * local_118->num_dimensions;
                      piVar29 = (local_118->indexes).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                      local_48 = (pointer)(1L << ((byte)iVar1 & 0x3f));
                      local_40 = piVar30;
                      piVar30 = (pointer)RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)3>
                                                   (pGVar24->order,piVar29[lVar19],
                                                    *(double *)
                                                     CONCAT71(local_100.
                                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  local_100.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_));
                      uVar20 = (pGVar24->super_BaseCanonicalGrid).num_dimensions;
                      if (1 < (int)uVar20) {
                        lVar25 = 1;
                        do {
                          local_38 = piVar30;
                          dVar4 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)3>
                                            (pGVar24->order,piVar29[lVar19 + lVar25],
                                             *(double *)
                                              (CONCAT71(local_100.
                                                                                                                
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  local_100.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                              lVar25 * 8));
                          piVar30 = (pointer)((double)local_38 * dVar4);
                          lVar25 = lVar25 + 1;
                          uVar20 = (pGVar24->super_BaseCanonicalGrid).num_dimensions;
                        } while (lVar25 < (int)uVar20);
                      }
                      if (0 < (int)uVar20) {
                        iVar17 = (local_110->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start[(long)local_108];
                        uVar26 = 0;
                        do {
                          local_50[(long)(int)(uVar20 * iVar1) + uVar26] =
                               local_50[(long)(int)(uVar20 * iVar1) + uVar26] -
                               local_50[(long)(int)uVar20 * (long)iVar17 + uVar26] * (double)piVar30
                          ;
                          uVar26 = uVar26 + 1;
                        } while (uVar20 != uVar26);
                      }
                      local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                      [(long)local_40 + (long)(iVar11 >> 6) + -1] =
                           local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [(long)local_40 + (long)(iVar11 >> 6) + -1] | (ulong)local_48;
                      iVar18 = iVar18 + 1;
                      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar12 + 1] = 0;
                      *(int *)((long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar12 * 4 + 4) = iVar1;
                      piVar10 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      pdVar14 = (pointer)local_c0.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start;
                      iVar28 = local_134;
                      iVar27 = local_11c;
                      iVar17 = local_120;
                      goto LAB_0019d07e;
                    }
                  }
                  piVar10[lVar12] = iVar21 + 1;
                }
                else {
                  iVar18 = iVar18 + -1;
                  piVar10[lVar12 + -1] = piVar10[lVar12 + -1] + 1;
                }
LAB_0019d07e:
              } while (*piVar10 < iVar27);
              piVar13 = (local_110->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              active_points = local_110;
              piVar29 = local_108;
            }
          }
          piVar29 = (pointer)((long)piVar29 + 1);
          piVar30 = (active_points->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        } while (piVar29 < (pointer)((long)piVar30 - (long)piVar13 >> 2));
      }
      iVar27 = (int)local_130;
      local_130 = (AccelerationContext *)(ulong)(iVar27 - 1);
      piVar9 = piVar30;
      piVar30 = piVar13;
    } while (1 < iVar27);
  }
  pvVar7 = (void *)CONCAT71(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_,
                            local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,(long)local_100.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar7);
  }
  if (local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
  }
  if ((pointer)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridLocalPolynomial::applyTransformationTransposed(double weights[], const MultiIndexSet &work, const std::vector<int> &active_points) const {
    Data2D<int> lparents = (parents.getNumStrips() != work.getNumIndexes()) ? // if the current dag loaded in parents does not reflect the indexes in work
                            HierarchyManipulations::computeDAGup<effrule>(work) :
                            Data2D<int>();

    const Data2D<int> &dagUp = (parents.getNumStrips() != work.getNumIndexes()) ? lparents : parents;

    std::vector<int> level(active_points.size());
    int active_top_level = 0;
    for(size_t i=0; i<active_points.size(); i++){
        const int *p = work.getIndex(active_points[i]);
        int current_level = RuleLocal::getLevel<effrule>(p[0]);
        for(int j=1; j<num_dimensions; j++){
            current_level += RuleLocal::getLevel<effrule>(p[j]);
        }
        if (active_top_level < current_level) active_top_level = current_level;
        level[i] = current_level;
    }

    std::vector<int> monkey_count(top_level+1);
    std::vector<int> monkey_tail(top_level+1);
    std::vector<bool> used(work.getNumIndexes());
    int max_parents = RuleLocal::getMaxNumParents<effrule>() * num_dimensions;

    std::vector<double> node(num_dimensions);

    for(int l=active_top_level; l>0; l--){
        for(size_t i=0; i<active_points.size(); i++){
            if (level[i] == l){
                int const *pnt = work.getIndex(active_points[i]);
                for(int j=0; j<num_dimensions; j++)
                    node[j] = RuleLocal::getNode<effrule>(pnt[j]);

                std::fill(used.begin(), used.end(), false);

                monkey_count[0] = 0;
                monkey_tail[0] = active_points[i];
                int current = 0;

                while(monkey_count[0] < max_parents){
                    if (monkey_count[current] < max_parents){
                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || used[branch]){
                            monkey_count[current]++;
                        }else{
                            const int *func = work.getIndex(branch);
                            double basis_value = RuleLocal::evalRaw<effrule>(order, func[0], node[0]);
                            for(int j=1; j<num_dimensions; j++) basis_value *= RuleLocal::evalRaw<effrule>(order, func[j], node[j]);

                            if (mode == 0) {
                                weights[branch] -= weights[active_points[i]] * basis_value;
                            } else {
                                for (int d=0; d<num_dimensions; d++)
                                    weights[branch * num_dimensions + d] -=
                                            weights[active_points[i] * num_dimensions + d] * basis_value;
                            }
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }
    }
}